

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32_Nested::_InternalSerialize
          (TestVerifyBigFieldNumberUint32_Nested *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TestVerifyBigFieldNumberUint32_Nested *value;
  ulong uVar2;
  bool bVar3;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>_>
  *value_00;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int index;
  byte *pbVar8;
  
  uVar7 = *(uint *)&this->field_0;
  if ((uVar7 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_1_;
    *target = '\b';
    pbVar8 = target + 1;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_2_;
    *target = 0x10;
    pbVar8 = target + 1;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 1) != 0) {
    value = (this->field_0)._impl_.optional_nested_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    index = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>>
                           (&(this->field_0)._impl_.repeated_nested_.super_RepeatedPtrFieldBase,
                            index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  if ((uVar7 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_63_;
    target[0] = 0xf8;
    target[1] = 3;
    pbVar8 = target + 2;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_64_;
    target[0] = 0x80;
    target[1] = 4;
    pbVar8 = target + 2;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_65_;
    target[0] = 0x88;
    target[1] = 4;
    pbVar8 = target + 2;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_66_;
    target[0] = 0x90;
    target[1] = 4;
    pbVar8 = target + 2;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((char)uVar7 < '\0') {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_uint32_1000_;
    target[0] = 0xc0;
    target[1] = 0x3e;
    pbVar8 = target + 2;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_5000_;
    target[0] = 0xc0;
    target[1] = 0xb8;
    target[2] = 2;
    pbVar8 = target + 3;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestVerifyBigFieldNumberUint32_Nested::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestVerifyBigFieldNumberUint32_Nested& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // uint32 optional_uint32_1 = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1, this_._internal_optional_uint32_1(), target);
  }

  // uint32 optional_uint32_2 = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        2, this_._internal_optional_uint32_2(), target);
  }

  // .edition_unittest.TestVerifyBigFieldNumberUint32.Nested optional_nested = 9;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.optional_nested_, this_._impl_.optional_nested_->GetCachedSize(), target,
        stream);
  }

  // repeated .edition_unittest.TestVerifyBigFieldNumberUint32.Nested repeated_nested = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_nested_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_nested().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // uint32 optional_uint32_63 = 63;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        63, this_._internal_optional_uint32_63(), target);
  }

  // uint32 optional_uint32_64 = 64;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        64, this_._internal_optional_uint32_64(), target);
  }

  // uint32 optional_uint32_65 = 65;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        65, this_._internal_optional_uint32_65(), target);
  }

  // uint32 optional_uint32_66 = 66;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        66, this_._internal_optional_uint32_66(), target);
  }

  // uint32 optional_uint32_1000 = 1000;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1000, this_._internal_optional_uint32_1000(), target);
  }

  // uint32 optional_uint32_5000 = 5000;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        5000, this_._internal_optional_uint32_5000(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  return target;
}